

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::BasicOcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BasicOcclusionQueryTestInstance *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  Context *this_01;
  VkCommandBuffer_s *this_02;
  bool bVar2;
  TestStatus *pTVar3;
  deUint32 _queueFamilyIndex;
  VkResult VVar4;
  VkDevice device;
  VkQueue pVVar5;
  DeviceInterface *vk;
  deUint64 *pdVar6;
  TestError *this_03;
  bool bVar7;
  int iVar8;
  deUint64 dVar9;
  bool bVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  DeviceInterface *pDStack_350;
  VkDevice local_348;
  deUint64 dStack_340;
  deUint64 queryResults [2];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_318;
  TestStatus *local_300;
  string local_2f8;
  string local_2d8;
  VkDeviceSize vertexBufferOffset;
  VkBuffer vertexBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_2a8;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [4];
  ios_base local_210 [264];
  RenderPassBeginInfo renderPassBegin;
  CmdBufferBeginInfo beginInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkSubmitInfo submitInfo;
  
  this_01 = (this->super_TestInstance).m_context;
  this_02 = (VkCommandBuffer_s *)this_01->m_testCtx->m_log;
  device = Context::getDevice(this_01);
  pVVar5 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&local_2a8,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_288,vk,device,
             (VkCommandPool)
             local_2a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_348 = (VkDevice)local_278._M_allocated_capacity;
  dStack_340 = local_278._8_8_;
  local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._0_8_;
  pDStack_350 = (DeviceInterface *)local_288._8_8_;
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  (*vk->_vptr_DeviceInterface[0x49])(vk,local_358,&beginInfo);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)local_358->_M_local_buf,
             (VkImage)(((this->m_stateObjects->m_colorAttachmentImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,0x100);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)local_358->_M_local_buf,
             (VkImage)(((this->m_stateObjects->m_DepthImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,2,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(float *)(local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) = 0.0;
  *(deUint32 *)
   ((long)(local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
           .super__Vector_impl_data._M_start + 1) + 4) = 0;
  *(undefined8 *)
   ((long)local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = 0;
  *(float *)local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
            _M_impl.super__Vector_impl_data._M_start = 0.0;
  *(deUint32 *)
   ((long)local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = 0;
  local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            (&renderPassBegin,
             (VkRenderPass)
             (this->m_stateObjects->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.
             m_data.object.m_internal,
             (VkFramebuffer)
             (this->m_stateObjects->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.
             m_data.object.m_internal,(VkRect2D)(ZEXT816(0x8000000080) << 0x40),&local_318);
  (*vk->_vptr_DeviceInterface[0x70])(vk,local_358,(this->m_queryPool).m_internal,0,2);
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_358,&renderPassBegin,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_358,0,
             (this->m_stateObjects->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.
             m_data.object.m_internal);
  vertexBuffer.m_internal =
       (((this->m_stateObjects->m_vertexBuffer).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_358,0,1);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_358,(this->m_queryPool).m_internal,0,
             (ulong)(this->m_testVector).queryControlFlags);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_358,(this->m_queryPool).m_internal,0);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_358,(this->m_queryPool).m_internal,1,
             (ulong)(this->m_testVector).queryControlFlags);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_358,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_358,(this->m_queryPool).m_internal,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_358);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)local_358->_M_local_buf,
             (VkImage)(((this->m_stateObjects->m_colorAttachmentImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0x100,0x800);
  (*vk->_vptr_DeviceInterface[0x4a])(vk,local_358);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_358;
  (*vk->_vptr_DeviceInterface[2])(vk,pVVar5,1,&submitInfo,0);
  VVar4 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar5);
  ::vk::checkResult(VVar4,"vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x1ab);
  queryResults[0] = 0;
  queryResults[1] = 0;
  VVar4 = (*vk->_vptr_DeviceInterface[0x20])
                    (vk,device,(this->m_queryPool).m_internal,0,2,0x10,queryResults,8,1);
  if (VVar4 == VK_NOT_READY) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Query result not avaliable, but vkWaitIdle() was called.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
               ,0x1b4);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::checkResult(VVar4,"queryResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x1b7);
  local_300 = __return_storage_ptr__;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"OcclusionQueryResults","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Occlusion query results","")
  ;
  tcu::LogSection::LogSection((LogSection *)local_288,&local_2d8,&local_2f8);
  tcu::TestLog::startSection((TestLog *)this_02,(char *)local_288._0_8_,local_268._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p != local_258) {
    operator_delete(local_268._M_p,local_258[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_278._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  poVar1 = (ostringstream *)(local_288 + 8);
  iVar8 = 0;
  bVar10 = true;
  do {
    bVar7 = bVar10;
    local_288._0_8_ = this_02;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"query[ slot == ",0xf);
    std::ostream::operator<<(poVar1,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] result == ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    iVar8 = 1;
    bVar10 = false;
  } while (bVar7);
  poVar1 = (ostringstream *)(local_288 + 8);
  this_00 = (ostringstream *)(local_288 + 8);
  pdVar6 = queryResults;
  iVar8 = 0;
  bVar7 = true;
  bVar10 = true;
  do {
    if (iVar8 == 0) {
      dVar9 = 0;
LAB_006ca1e8:
      if (*pdVar6 != dVar9) {
        local_288._0_8_ = this_02;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "vkGetQueryPoolResults returned wrong value of query for index ",0x3e);
        std::ostream::operator<<(this_00,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_006ca28f:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_288 + 8));
        std::ios_base::~ios_base(local_210);
        bVar7 = false;
      }
    }
    else {
      dVar9 = 3;
      if (((this->m_testVector).queryControlFlags & 1) != 0) goto LAB_006ca1e8;
      if (*pdVar6 == 0) {
        local_288._0_8_ = this_02;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "vkGetQueryPoolResults returned wrong value of query for index ",0x3e);
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", expected any non-zero value, got ",0x23);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_006ca28f;
      }
    }
    iVar8 = 1;
    pdVar6 = queryResults + 1;
    bVar2 = !bVar10;
    bVar10 = false;
    if (bVar2) {
      tcu::TestLog::endSection((TestLog *)this_02);
      pTVar3 = local_300;
      local_288._0_8_ = &local_278;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"Query result verification passed","");
        pTVar3->m_code = QP_TEST_RESULT_PASS;
        (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar3->m_description,local_288._0_8_,
                   (char *)(local_288._0_8_ + (long)(_func_int ***)local_288._8_8_));
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"Query result verification failed","");
        pTVar3->m_code = QP_TEST_RESULT_FAIL;
        (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar3->m_description,local_288._0_8_,
                   (char *)(local_288._0_8_ + (long)(_func_int ***)local_288._8_8_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._0_8_ != &local_278) {
        operator_delete((void *)local_288._0_8_,(ulong)(local_278._M_allocated_capacity + 1));
      }
      if (renderPassBegin.m_clearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(renderPassBegin.m_clearValues.
                        super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)renderPassBegin.m_clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)renderPassBegin.m_clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_318.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_318.
                        super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_318.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_318.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_358 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_288._0_8_ = local_358;
        (*pDStack_350->_vptr_DeviceInterface[0x48])(pDStack_350,local_348,dStack_340,1);
      }
      if (local_2a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&local_2a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkCommandPool)
                   local_2a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                  );
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

tcu::TestStatus	BasicOcclusionQueryTestInstance::iterate (void)
{
	tcu::TestLog &log				= m_context.getTestContext().getLog();
	const vk::VkDevice device		= m_context.getDevice();
	const vk::VkQueue queue			= m_context.getUniversalQueue();
	const vk::DeviceInterface& vk	= m_context.getDeviceInterface();

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	vk::Move<vk::VkCommandPool>		cmdPool				= vk::createCommandPool(vk, device, &cmdPoolCreateInfo);

	vk::Unique<vk::VkCommandBuffer> cmdBuffer			(vk::allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const CmdBufferBeginInfo		beginInfo			(0u);

	vk.beginCommandBuffer(*cmdBuffer, &beginInfo);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL, 0, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_DepthImage->object(), vk::VK_IMAGE_ASPECT_DEPTH_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

	std::vector<vk::VkClearValue> renderPassClearValues(2);
	deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(vk::VkClearValue));

	const vk::VkRect2D renderArea =
	{
		{ 0,					0 },
		{ StateObjects::WIDTH,	StateObjects::HEIGHT }
	};

	RenderPassBeginInfo renderPassBegin(*m_stateObjects->m_renderPass, *m_stateObjects->m_framebuffer, renderArea, renderPassClearValues);

	vk.cmdResetQueryPool(*cmdBuffer, m_queryPool, 0, NUM_QUERIES_IN_POOL);

	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_stateObjects->m_pipeline);

	vk::VkBuffer vertexBuffer = m_stateObjects->m_vertexBuffer->object();
	const vk::VkDeviceSize vertexBufferOffset = 0;
	vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_EMPTY, m_testVector.queryControlFlags);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_EMPTY);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_DRAWCALL, m_testVector.queryControlFlags);
	vk.cmdDraw(*cmdBuffer, NUM_VERTICES_IN_DRAWCALL, 1, 0, 0);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_DRAWCALL);

	vk.cmdEndRenderPass(*cmdBuffer);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_GENERAL, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, vk::VK_ACCESS_TRANSFER_READ_BIT);

	vk.endCommandBuffer(*cmdBuffer);

	// Submit command buffer
	const vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,									// deUint32					waitSemaphoreCount;
		DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,									// deUint32					commandBufferCount;
		&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,									// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

	VK_CHECK(vk.queueWaitIdle(queue));

	deUint64 queryResults[NUM_QUERIES_IN_POOL] = { 0 };
	size_t queryResultsSize		= sizeof(queryResults);

	vk::VkResult queryResult	= vk.getQueryPoolResults(device, m_queryPool, 0, NUM_QUERIES_IN_POOL, queryResultsSize, queryResults, sizeof(queryResults[0]), vk::VK_QUERY_RESULT_64_BIT);

	if (queryResult == vk::VK_NOT_READY)
	{
		TCU_FAIL("Query result not avaliable, but vkWaitIdle() was called.");
	}

	VK_CHECK(queryResult);

	log << tcu::TestLog::Section("OcclusionQueryResults",
		"Occlusion query results");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(queryResults); ++ndx)
	{
		log << tcu::TestLog::Message << "query[ slot == " << ndx
			<< "] result == " << queryResults[ndx] << tcu::TestLog::EndMessage;
	}

	bool passed = true;

	for (int queryNdx = 0; queryNdx < DE_LENGTH_OF_ARRAY(queryResults); ++queryNdx)
	{

		deUint64 expectedValue;

		switch (queryNdx)
		{
			case QUERY_INDEX_CAPTURE_EMPTY:
				expectedValue = 0;
				break;
			case QUERY_INDEX_CAPTURE_DRAWCALL:
				expectedValue = NUM_VERTICES_IN_DRAWCALL;
				break;
		}

		if ((m_testVector.queryControlFlags & vk::VK_QUERY_CONTROL_PRECISE_BIT) || expectedValue == 0)
		{
			// require precise value
			if (queryResults[queryNdx] != expectedValue)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected " << expectedValue << ", got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
		else
		{
			// require imprecize value > 0
			if (queryResults[queryNdx] == 0)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected any non-zero value, got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
	}
	log << tcu::TestLog::EndSection;

	if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}